

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall cmCacheManager::CacheIterator::Find(CacheIterator *this,string *key)

{
  bool bVar1;
  iterator iVar2;
  string *key_local;
  CacheIterator *this_local;
  
  iVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
          ::find(&this->Container->Cache,key);
  (this->Position)._M_node = iVar2._M_node;
  bVar1 = IsAtEnd(this);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool cmCacheManager::CacheIterator::Find(const std::string& key)
{
  this->Position = this->Container.Cache.find(key);
  return !this->IsAtEnd();
}